

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::CategoricalDistributionLayerParams
          (CategoricalDistributionLayerParams *this,CategoricalDistributionLayerParams *from)

{
  ulong uVar1;
  int64_t iVar2;
  int64_t iVar3;
  float fVar4;
  float fVar5;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CategoricalDistributionLayerParams_0048b7e0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  iVar2 = from->seed_;
  iVar3 = from->numsamples_;
  fVar4 = from->eps_;
  fVar5 = from->temperature_;
  *(undefined8 *)((long)&this->numsamples_ + 4) = *(undefined8 *)((long)&from->numsamples_ + 4);
  this->eps_ = fVar4;
  this->temperature_ = fVar5;
  this->seed_ = iVar2;
  this->numsamples_ = iVar3;
  return;
}

Assistant:

CategoricalDistributionLayerParams::CategoricalDistributionLayerParams(const CategoricalDistributionLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    static_cast<size_t>(reinterpret_cast<char*>(&temperature_) -
    reinterpret_cast<char*>(&seed_)) + sizeof(temperature_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CategoricalDistributionLayerParams)
}